

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_ManReadRange(Prs_Man_t *p)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iData1;
  int iVar4;
  ulong uVar5;
  uint iData2;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar6;
  char *pError;
  byte *pbVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  
  if (*p->pCur != '[') {
    __assert_fail("Prs_ManIsChar(p, \'[\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x20b,"int Prs_ManReadRange(Prs_Man_t *)");
  }
  pbVar7 = (byte *)(p->pCur + 1);
  p->pCur = (char *)pbVar7;
  pbVar1 = (byte *)p->pLimit;
joined_r0x003e8478:
  if (pbVar1 <= pbVar7) {
LAB_003e852b:
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] == '\0') {
        uVar8._0_1_ = 'E';
        uVar8._1_1_ = 'r';
        uVar8._2_1_ = 'r';
        uVar8._3_1_ = 'o';
        uVar9._0_1_ = 'r';
        uVar9._1_1_ = ' ';
        uVar9._2_1_ = 'n';
        uVar9._3_1_ = 'u';
        uVar10._0_1_ = 'm';
        uVar10._1_1_ = 'b';
        uVar10._2_1_ = 'e';
        uVar10._3_1_ = 'r';
        uVar11._0_1_ = ' ';
        uVar11._1_1_ = '3';
        uVar11._2_1_ = '.';
        uVar11._3_1_ = '\0';
LAB_003e884a:
        *(undefined4 *)p->ErrorStr = uVar8;
        *(undefined4 *)(p->ErrorStr + 4) = uVar9;
        *(undefined4 *)(p->ErrorStr + 8) = uVar10;
        *(undefined4 *)(p->ErrorStr + 0xc) = uVar11;
        return 0;
      }
    }
LAB_003e8954:
    __assert_fail("!p->ErrorStr[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                  ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
  }
  while( true ) {
    uVar5 = (ulong)*pbVar7;
    if (0x2f < uVar5) goto LAB_003e857a;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
    pbVar7 = pbVar7 + 1;
    p->pCur = (char *)pbVar7;
  }
  if (uVar5 == 0x2f) {
    if (pbVar7[1] != 0x2a) {
      if (pbVar7[1] == 0x2f) {
        pbVar7 = pbVar7 + 2;
        p->pCur = (char *)pbVar7;
        if (pbVar7 < pbVar1) {
          while (bVar2 = *pbVar7, pbVar7 = pbVar7 + 1, bVar2 != 10) {
            p->pCur = (char *)pbVar7;
            if (pbVar7 == pbVar1) goto LAB_003e857a;
          }
          goto LAB_003e8517;
        }
      }
      goto LAB_003e857a;
    }
    pbVar7 = pbVar7 + 2;
    p->pCur = (char *)pbVar7;
    if (pbVar1 <= pbVar7) goto LAB_003e857a;
    while ((*pbVar7 != 0x2a || (pbVar7[1] != 0x2f))) {
      pbVar7 = pbVar7 + 1;
      p->pCur = (char *)pbVar7;
      if (pbVar7 == pbVar1) goto LAB_003e857a;
    }
    pbVar7 = pbVar7 + 2;
LAB_003e8517:
    p->pCur = (char *)pbVar7;
    goto joined_r0x003e8478;
  }
  if (uVar5 == 0) goto LAB_003e852b;
LAB_003e857a:
  if ((byte)(*pbVar7 - 0x3a) < 0xf6) {
    if (p->ErrorStr[0] != '\0') goto LAB_003e8954;
    builtin_strncpy(p->ErrorStr + 0x10,"t in range specification.",0x1a);
    uVar8._0_1_ = 'C';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = 'n';
    uVar9._0_1_ = 'o';
    uVar9._1_1_ = 't';
    uVar9._2_1_ = ' ';
    uVar9._3_1_ = 'r';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'a';
    uVar10._2_1_ = 'd';
    uVar10._3_1_ = ' ';
    uVar11._0_1_ = 'd';
    uVar11._1_1_ = 'i';
    uVar11._2_1_ = 'g';
    uVar11._3_1_ = 'i';
    goto LAB_003e884a;
  }
  iVar3 = atoi((char *)pbVar7);
  do {
    pbVar7 = pbVar7 + 1;
    p->pCur = (char *)pbVar7;
  } while (0xf5 < (byte)(*pbVar7 - 0x3a));
  do {
    if (pbVar1 <= pbVar7) {
LAB_003e8800:
      if (p->ErrorStr[0] == '\0') {
        builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
        if (p->ErrorStr[0] != '\0') goto LAB_003e8954;
        uVar8._0_1_ = 'E';
        uVar8._1_1_ = 'r';
        uVar8._2_1_ = 'r';
        uVar8._3_1_ = 'o';
        uVar9._0_1_ = 'r';
        uVar9._1_1_ = ' ';
        uVar9._2_1_ = 'n';
        uVar9._3_1_ = 'u';
        uVar10._0_1_ = 'm';
        uVar10._1_1_ = 'b';
        uVar10._2_1_ = 'e';
        uVar10._3_1_ = 'r';
        uVar11._0_1_ = ' ';
        uVar11._1_1_ = '4';
        uVar11._2_1_ = '.';
        uVar11._3_1_ = '\0';
        goto LAB_003e884a;
      }
      goto LAB_003e8954;
    }
    while( true ) {
      bVar2 = *pbVar7;
      uVar5 = (ulong)bVar2;
      iVar6 = extraout_EDX;
      if (0x2f < uVar5) goto LAB_003e8676;
      if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
      pbVar7 = pbVar7 + 1;
      p->pCur = (char *)pbVar7;
    }
    if (uVar5 != 0x2f) {
      if (uVar5 != 0) {
LAB_003e8676:
        iData1 = iVar3;
        if (bVar2 != 0x3a) goto LAB_003e872c;
        pbVar7 = pbVar7 + 1;
        break;
      }
      goto LAB_003e8800;
    }
    if (pbVar7[1] == 0x2a) {
      pbVar7 = pbVar7 + 2;
      p->pCur = (char *)pbVar7;
      if (pbVar1 <= pbVar7) {
LAB_003e8673:
        bVar2 = *pbVar7;
        goto LAB_003e8676;
      }
      while ((*pbVar7 != 0x2a || (pbVar7[1] != 0x2f))) {
        pbVar7 = pbVar7 + 1;
        p->pCur = (char *)pbVar7;
        if (pbVar7 == pbVar1) goto LAB_003e8673;
      }
      pbVar7 = pbVar7 + 2;
    }
    else {
      if (pbVar7[1] != 0x2f) goto LAB_003e87eb;
      pbVar7 = pbVar7 + 2;
      p->pCur = (char *)pbVar7;
      if (pbVar1 <= pbVar7) goto LAB_003e8673;
      while (bVar2 = *pbVar7, pbVar7 = pbVar7 + 1, bVar2 != 10) {
        p->pCur = (char *)pbVar7;
        if (pbVar7 == pbVar1) goto LAB_003e8673;
      }
    }
    p->pCur = (char *)pbVar7;
  } while( true );
LAB_003e8681:
  p->pCur = (char *)pbVar7;
  if (pbVar1 <= pbVar7) {
LAB_003e885d:
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] != '\0') goto LAB_003e8954;
      uVar8._0_1_ = 'E';
      uVar8._1_1_ = 'r';
      uVar8._2_1_ = 'r';
      uVar8._3_1_ = 'o';
      uVar9._0_1_ = 'r';
      uVar9._1_1_ = ' ';
      uVar9._2_1_ = 'n';
      uVar9._3_1_ = 'u';
      uVar10._0_1_ = 'm';
      uVar10._1_1_ = 'b';
      uVar10._2_1_ = 'e';
      uVar10._3_1_ = 'r';
      uVar11._0_1_ = ' ';
      uVar11._1_1_ = '5';
      uVar11._2_1_ = '.';
      uVar11._3_1_ = '\0';
      goto LAB_003e884a;
    }
    goto LAB_003e8954;
  }
  while( true ) {
    uVar5 = (ulong)*pbVar7;
    if (0x2f < uVar5) goto LAB_003e88a9;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
    pbVar7 = pbVar7 + 1;
    p->pCur = (char *)pbVar7;
  }
  if (uVar5 == 0x2f) {
    if (pbVar7[1] == 0x2a) {
      pbVar7 = pbVar7 + 2;
      p->pCur = (char *)pbVar7;
      if (pbVar1 <= pbVar7) goto LAB_003e88a9;
      while ((*pbVar7 != 0x2a || (pbVar7[1] != 0x2f))) {
        pbVar7 = pbVar7 + 1;
        p->pCur = (char *)pbVar7;
        if (pbVar7 == pbVar1) goto LAB_003e88a9;
      }
      pbVar7 = pbVar7 + 2;
      goto LAB_003e8681;
    }
    if (pbVar7[1] != 0x2f) goto LAB_003e88a9;
    pbVar7 = pbVar7 + 2;
    p->pCur = (char *)pbVar7;
    if (pbVar7 < pbVar1) {
      while (bVar2 = *pbVar7, pbVar7 = pbVar7 + 1, bVar2 != 10) {
        p->pCur = (char *)pbVar7;
        if (pbVar7 == pbVar1) goto LAB_003e88a9;
      }
      goto LAB_003e8681;
    }
  }
  else if (uVar5 == 0) goto LAB_003e885d;
LAB_003e88a9:
  if ((byte)(*pbVar7 - 0x3a) < 0xf6) {
    pError = "Cannot read digit in range specification.";
    goto LAB_003e8931;
  }
  iData1 = atoi((char *)pbVar7);
  do {
    pbVar7 = pbVar7 + 1;
    p->pCur = (char *)pbVar7;
  } while (0xf5 < (byte)(*pbVar7 - 0x3a));
  iVar4 = Prs_ManUtilSkipSpaces(p);
  iVar6 = extraout_EDX_00;
  if (iVar4 != 0) {
    pError = "Error number 6.";
    goto LAB_003e8931;
  }
  pbVar7 = (byte *)p->pCur;
  bVar2 = *pbVar7;
LAB_003e872c:
  if (bVar2 != 0x5d) {
LAB_003e87eb:
    pError = "Cannot read closing brace in range specification.";
LAB_003e8931:
    Prs_ManErrorSet(p,pError,iVar6);
    return 0;
  }
  pbVar7 = pbVar7 + 1;
  p->pCur = (char *)pbVar7;
  pbVar1 = (byte *)p->pLimit;
  do {
    if (pbVar1 <= pbVar7) {
LAB_003e88ff:
      if (p->ErrorStr[0] != '\0') goto LAB_003e8954;
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      pError = "Error number 6a.";
      goto LAB_003e8931;
    }
    while( true ) {
      uVar5 = (ulong)*pbVar7;
      iData2 = (uint)*pbVar7;
      if (0x2f < uVar5) goto LAB_003e893e;
      if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) break;
      pbVar7 = pbVar7 + 1;
      p->pCur = (char *)pbVar7;
    }
    if (uVar5 != 0x2f) {
      if (uVar5 != 0) goto LAB_003e893e;
      goto LAB_003e88ff;
    }
    bVar2 = pbVar7[1];
    iData2 = (uint)bVar2;
    if (bVar2 == 0x2a) {
      pbVar7 = pbVar7 + 2;
      p->pCur = (char *)pbVar7;
      if (pbVar1 <= pbVar7) goto LAB_003e893e;
      while ((*pbVar7 != 0x2a || (pbVar7[1] != 0x2f))) {
        pbVar7 = pbVar7 + 1;
        p->pCur = (char *)pbVar7;
        if (pbVar7 == pbVar1) goto LAB_003e893e;
      }
      pbVar7 = pbVar7 + 2;
    }
    else {
      if (bVar2 != 0x2f) {
LAB_003e893e:
        iVar3 = Hash_Int2ManInsert(p->vHash,iVar3,iData1,iData2);
        return iVar3;
      }
      pbVar7 = pbVar7 + 2;
      p->pCur = (char *)pbVar7;
      if (pbVar1 <= pbVar7) goto LAB_003e893e;
      while (*pbVar7 != 10) {
        pbVar7 = pbVar7 + 1;
        p->pCur = (char *)pbVar7;
        if (pbVar7 == pbVar1) goto LAB_003e893e;
      }
      pbVar7 = pbVar7 + 1;
    }
    p->pCur = (char *)pbVar7;
  } while( true );
}

Assistant:

static inline int Prs_ManReadRange( Prs_Man_t * p )
{
    int Left, Right;
    assert( Prs_ManIsChar(p, '[') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 3.", 0);
    if ( !Prs_ManIsDigit(p) )               return Prs_ManErrorSet(p, "Cannot read digit in range specification.", 0);
    Left = Right = atoi(p->pCur);
    while ( Prs_ManIsDigit(p) ) 
        p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 4.", 0);
    if ( Prs_ManIsChar(p, ':') )
    {
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 5.", 0);
        if ( !Prs_ManIsDigit(p) )           return Prs_ManErrorSet(p, "Cannot read digit in range specification.", 0);
        Right = atoi(p->pCur);
        while ( Prs_ManIsDigit(p) ) 
            p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 6.", 0);
    }
    if ( !Prs_ManIsChar(p, ']') )           return Prs_ManErrorSet(p, "Cannot read closing brace in range specification.", 0);
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 6a.", 0);
    return Hash_Int2ManInsert( p->vHash, Left, Right, 0 );
}